

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O0

void __thiscall Generator::addEnums(Generator *this)

{
  FILE *pFVar1;
  bool bVar2;
  Int IVar3;
  uint uVar4;
  EnumDef *pEVar5;
  char *pcVar6;
  char *pcVar7;
  const_iterator o;
  long in_RDI;
  long in_FS_OFFSET;
  QByteArray *val;
  QList<QByteArray> *__range2;
  QByteArray *typeName;
  EnumDef *e;
  add_const_t<QList<EnumDef>_> *__range1;
  const_iterator __end2;
  const_iterator __begin2;
  QByteArray prefix;
  anon_class_16_2_ccb47752 addFlag;
  char *separator;
  const_iterator __end1;
  const_iterator __begin1;
  int in_stack_fffffffffffffee8;
  EnumFlags in_stack_fffffffffffffeec;
  Generator *in_stack_fffffffffffffef0;
  char *local_c8;
  const_iterator local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  QFlagsStorageHelper<QtMocConstants::EnumFlags,_4> local_48;
  QFlagsStorageHelper<QtMocConstants::EnumFlags,_4> local_44;
  char **local_38;
  char *local_30;
  QFlagsStorageHelper<QtMocConstants::EnumFlags,_4> local_24;
  EnumDef *local_20;
  const_iterator local_18;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10.i = (EnumDef *)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = QList<EnumDef>::begin((QList<EnumDef> *)in_stack_fffffffffffffef0);
  local_18.i = (EnumDef *)&DAT_aaaaaaaaaaaaaaaa;
  local_18 = QList<EnumDef>::end((QList<EnumDef> *)in_stack_fffffffffffffef0);
  while( true ) {
    local_20 = local_18.i;
    bVar2 = QList<EnumDef>::const_iterator::operator!=(&local_10,local_18);
    if (!bVar2) break;
    pEVar5 = QList<EnumDef>::const_iterator::operator*(&local_10);
    QByteArray::isNull((QByteArray *)0x10c7a3);
    pFVar1 = *(FILE **)(in_RDI + 8);
    local_24.super_QFlagsStorage<QtMocConstants::EnumFlags>.i =
         (QFlagsStorage<QtMocConstants::EnumFlags>)
         QFlags<QtMocConstants::EnumFlags>::operator&
                   ((QFlags<QtMocConstants::EnumFlags> *)in_stack_fffffffffffffef0,
                    in_stack_fffffffffffffeec);
    IVar3 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_24);
    if (IVar3 == 0) {
      local_c8 = "enum";
    }
    else {
      local_c8 = "flag";
    }
    pcVar6 = QByteArray::constData((QByteArray *)0x10c846);
    pcVar7 = QByteArray::constData((QByteArray *)0x10c858);
    uVar4 = stridx(in_stack_fffffffffffffef0,
                   (QByteArray *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    in_stack_fffffffffffffee8 =
         stridx(in_stack_fffffffffffffef0,
                (QByteArray *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    fprintf(pFVar1,"        // %s \'%s\'\n        QtMocHelpers::EnumData<%s>(%d, %d,",local_c8,
            pcVar6,pcVar7,(ulong)uVar4);
    IVar3 = QFlags::operator_cast_to_unsigned_int((QFlags *)&pEVar5->flags);
    if (IVar3 == 0) {
      fprintf(*(FILE **)(in_RDI + 8)," QMC::EnumFlags{}");
    }
    else {
      local_30 = "";
      local_38 = &local_30;
      local_44.super_QFlagsStorage<QtMocConstants::EnumFlags>.i =
           (QFlagsStorage<QtMocConstants::EnumFlags>)
           QFlags<QtMocConstants::EnumFlags>::operator&
                     ((QFlags<QtMocConstants::EnumFlags> *)in_stack_fffffffffffffef0,
                      in_stack_fffffffffffffeec);
      IVar3 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_44);
      if (IVar3 != 0) {
        addEnums::anon_class_16_2_ccb47752::operator()
                  ((anon_class_16_2_ccb47752 *)in_stack_fffffffffffffef0,
                   (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      }
      local_48.super_QFlagsStorage<QtMocConstants::EnumFlags>.i =
           (QFlagsStorage<QtMocConstants::EnumFlags>)
           QFlags<QtMocConstants::EnumFlags>::operator&
                     ((QFlags<QtMocConstants::EnumFlags> *)in_stack_fffffffffffffef0,
                      in_stack_fffffffffffffeec);
      IVar3 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_48);
      if (IVar3 != 0) {
        addEnums::anon_class_16_2_ccb47752::operator()
                  ((anon_class_16_2_ccb47752 *)in_stack_fffffffffffffef0,
                   (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      }
    }
    bVar2 = QList<QByteArray>::isEmpty((QList<QByteArray> *)0x10c9c3);
    if (bVar2) {
      fprintf(*(FILE **)(in_RDI + 8),"),\n");
    }
    else {
      fprintf(*(FILE **)(in_RDI + 8),").add({\n");
      local_60 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      local_50 = &DAT_aaaaaaaaaaaaaaaa;
      QByteArray::isNull((QByteArray *)0x10ca3a);
      QByteArray::QByteArray
                ((QByteArray *)in_stack_fffffffffffffef0,
                 (QByteArray *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      local_68.i = (QByteArray *)&DAT_aaaaaaaaaaaaaaaa;
      local_68 = QList<QByteArray>::begin((QList<QByteArray> *)in_stack_fffffffffffffef0);
      o = QList<QByteArray>::end((QList<QByteArray> *)in_stack_fffffffffffffef0);
      while (bVar2 = QList<QByteArray>::const_iterator::operator!=(&local_68,o), bVar2) {
        QList<QByteArray>::const_iterator::operator*(&local_68);
        pFVar1 = *(FILE **)(in_RDI + 8);
        uVar4 = stridx(in_stack_fffffffffffffef0,
                       (QByteArray *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
        pcVar6 = QByteArray::constData((QByteArray *)0x10cb4c);
        pcVar7 = QByteArray::constData((QByteArray *)0x10cb5b);
        fprintf(pFVar1,"            { %4d, %s::%s },\n",(ulong)uVar4,pcVar6,pcVar7);
        QList<QByteArray>::const_iterator::operator++(&local_68);
      }
      fprintf(*(FILE **)(in_RDI + 8),"        }),\n");
      QByteArray::~QByteArray((QByteArray *)0x10cbb0);
    }
    QList<EnumDef>::const_iterator::operator++(&local_10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Generator::addEnums()
{
    for (const EnumDef &e : std::as_const(cdef->enumList)) {
        const QByteArray &typeName = e.enumName.isNull() ? e.name : e.enumName;
        fprintf(out, "        // %s '%s'\n"
                     "        QtMocHelpers::EnumData<%s>(%d, %d,",
                e.flags & EnumIsFlag ? "flag" : "enum", e.name.constData(),
                e.name.constData(), stridx(e.name), stridx(typeName));

        if (e.flags) {
            const char *separator = "";
            auto addFlag = [this, &separator](const char *text) {
                fprintf(out, "%s QMC::%s", separator, text);
                separator = " |";
            };
            if (e.flags & EnumIsFlag)
                addFlag("EnumIsFlag");
            if (e.flags & EnumIsScoped)
                addFlag("EnumIsScoped");
        } else {
            fprintf(out, " QMC::EnumFlags{}");
        }

        if (e.values.isEmpty()) {
            fprintf(out, "),\n");
            continue;
        }

        // add the enumerations
        fprintf(out, ").add({\n");
        QByteArray prefix = (e.enumName.isNull() ? e.name : e.enumName);
        for (const QByteArray &val : e.values) {
            fprintf(out, "            { %4d, %s::%s },\n", stridx(val),
                    prefix.constData(), val.constData());
        }

        fprintf(out, "        }),\n");
    }
}